

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall ktx::ValidationContext::validateHeader(ValidationContext *this)

{
  ktx_uint32_t kVar1;
  bool bVar2;
  int iVar3;
  int extraout_EAX;
  ulong uVar4;
  uint *puVar5;
  ValidationContext *in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  uint32_t fullMipPyramidLevelCount;
  uint max_dim;
  ktxSupercmpScheme supercompressionScheme;
  VkFormat vkFormat;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd10;
  undefined8 in_stack_fffffffffffffd30;
  VkFormat format;
  undefined8 in_stack_fffffffffffffd80;
  VkFormat format_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  string *in_stack_fffffffffffffd98;
  KTX_header2 *issue;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  uint in_stack_fffffffffffffdb8;
  uint in_stack_fffffffffffffdbc;
  string local_240 [4];
  ktxSupercmpScheme in_stack_fffffffffffffdc4;
  string local_220 [16];
  IssueFatal *in_stack_fffffffffffffdf0;
  ValidationContext *in_stack_fffffffffffffdf8;
  string local_200 [32];
  uint local_1e0;
  uint local_1dc;
  string local_1d8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  IssueWarning *in_stack_fffffffffffffe40;
  ValidationContext *in_stack_fffffffffffffe48;
  uint local_194;
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_40 [32];
  ktxSupercmpScheme local_20;
  VkFormat local_1c;
  undefined8 local_18;
  undefined8 local_10;
  
  format_00 = (VkFormat)((ulong)in_stack_fffffffffffffd80 >> 0x20);
  format = (VkFormat)((ulong)in_stack_fffffffffffffd30 >> 0x20);
  issue = &in_RDI->header;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffd10,
             (char *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  (**(code **)(*(long *)&in_RDI->_vptr_ValidationContext + 0x10))
            (in_RDI,0,issue,0x50,local_18,local_10);
  local_1c = (in_RDI->header).vkFormat;
  local_20 = (in_RDI->header).supercompressionScheme;
  iVar3 = memcmp(&in_RDI->header,validateHeader::ktx2_identifier_reference,0xc);
  if (iVar3 != 0) {
    fatal<>(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  }
  uVar4 = isProhibitedFormat(local_1c);
  if ((uVar4 & 1) == 0) {
    bVar2 = isFormatValid(VK_FORMAT_UNDEFINED);
    if (!bVar2) {
      if ((int)local_1c < 0xb9) {
        in_stack_fffffffffffffd90 = &local_70;
        toString_abi_cxx11_(format_00);
        error<std::__cxx11::string>
                  ((ValidationContext *)
                   CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                   (IssueError *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
        std::__cxx11::string::~string((string *)&local_70);
      }
      if ((0xb8 < (int)local_1c) && ((int)local_1c < 0x3b9acde8)) {
        toString_abi_cxx11_(format_00);
        error<std::__cxx11::string>
                  ((ValidationContext *)
                   CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                   (IssueError *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
        std::__cxx11::string::~string(local_90);
      }
      if ((0x3b9acde7 < (int)local_1c) && (bVar2 = isFormatKnown(format), !bVar2)) {
        format_00 = (VkFormat)((ulong)local_b0 >> 0x20);
        toString_abi_cxx11_(format_00);
        warning<std::__cxx11::string>
                  (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        std::__cxx11::string::~string(local_b0);
      }
    }
  }
  else {
    in_stack_fffffffffffffd98 = local_40;
    toString_abi_cxx11_(format_00);
    error<std::__cxx11::string>
              ((ValidationContext *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
               (IssueError *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    std::__cxx11::string::~string(local_40);
  }
  if (((in_RDI->header).supercompressionScheme == 1) && ((in_RDI->header).vkFormat != 0)) {
    toString_abi_cxx11_(format_00);
    error<std::__cxx11::string>
              ((ValidationContext *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
               (IssueError *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    std::__cxx11::string::~string(local_d0);
  }
  if ((in_RDI->header).vkFormat == 0) {
    if ((in_RDI->header).typeSize != 1) {
      toString_abi_cxx11_(format_00);
      error<unsigned_int&,std::__cxx11::string>
                (in_RDI,(IssueError *)issue,(uint *)in_stack_fffffffffffffd98,
                 in_stack_fffffffffffffd90);
      std::__cxx11::string::~string(local_f0);
    }
  }
  else {
    bVar2 = isFormatBlockCompressed(local_1c);
    if ((bVar2) && ((in_RDI->header).typeSize != 1)) {
      toString_abi_cxx11_(format_00);
      error<unsigned_int&,std::__cxx11::string>
                (in_RDI,(IssueError *)issue,(uint *)in_stack_fffffffffffffd98,
                 in_stack_fffffffffffffd90);
      std::__cxx11::string::~string(local_110);
    }
  }
  if ((in_RDI->header).pixelWidth == 0) {
    error<>(in_RDI,(IssueError *)issue);
  }
  bVar2 = isFormatBlockCompressed(local_1c);
  if ((bVar2) && ((in_RDI->header).pixelHeight == 0)) {
    toString_abi_cxx11_(format_00);
    error<std::__cxx11::string>
              ((ValidationContext *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
               (IssueError *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    std::__cxx11::string::~string(local_130);
  }
  bVar2 = isSupercompressionBlockCompressed(local_20);
  if ((bVar2) && ((in_RDI->header).pixelHeight == 0)) {
    toString_abi_cxx11_(in_stack_fffffffffffffdc4);
    error<std::__cxx11::string>
              ((ValidationContext *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
               (IssueError *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    std::__cxx11::string::~string(local_150);
  }
  if (((in_RDI->header).faceCount == 6) &&
     ((in_RDI->header).pixelWidth != (in_RDI->header).pixelHeight)) {
    error<unsigned_int&,unsigned_int&>
              (in_RDI,(IssueError *)issue,(uint *)in_stack_fffffffffffffd98,
               (uint *)in_stack_fffffffffffffd90);
  }
  if (((in_RDI->header).pixelDepth != 0) && ((in_RDI->header).pixelHeight == 0)) {
    error<unsigned_int&>
              ((ValidationContext *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
               (IssueError *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               (uint *)in_RDI);
  }
  bVar2 = isFormat3DBlockCompressed(local_1c);
  if ((bVar2) && ((in_RDI->header).pixelDepth == 0)) {
    toString_abi_cxx11_(format_00);
    error<std::__cxx11::string>
              ((ValidationContext *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
               (IssueError *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    std::__cxx11::string::~string(local_170);
  }
  bVar2 = isFormatDepth(local_1c);
  if (((bVar2) || (bVar2 = isFormatStencil(local_1c), bVar2)) && ((in_RDI->header).pixelDepth != 0))
  {
    toString_abi_cxx11_(format_00);
    error<unsigned_int&,std::__cxx11::string>
              (in_RDI,(IssueError *)issue,(uint *)in_stack_fffffffffffffd98,
               in_stack_fffffffffffffd90);
    std::__cxx11::string::~string(local_190);
  }
  if (((in_RDI->header).faceCount == 6) && ((in_RDI->header).pixelDepth != 0)) {
    error<unsigned_int&>
              ((ValidationContext *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
               (IssueError *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               (uint *)in_RDI);
  }
  if ((in_RDI->header).pixelDepth == 0) {
    if ((in_RDI->header).pixelHeight == 0) {
      in_RDI->dimensionCount = 1;
    }
    else {
      in_RDI->dimensionCount = 2;
    }
  }
  else {
    in_RDI->dimensionCount = 3;
    if ((in_RDI->header).layerCount != 0) {
      warning<>(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    }
  }
  local_194 = 1;
  puVar5 = std::max<unsigned_int>(&(in_RDI->header).layerCount,&local_194);
  in_RDI->numLayers = *puVar5;
  if (((in_RDI->header).faceCount != 6) && ((in_RDI->header).faceCount != 1)) {
    error<unsigned_int&>
              ((ValidationContext *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
               (IssueError *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               (uint *)in_RDI);
  }
  bVar2 = isFormatBlockCompressed(local_1c);
  if ((bVar2) && ((in_RDI->header).levelCount == 0)) {
    toString_abi_cxx11_(format_00);
    error<std::__cxx11::string>
              ((ValidationContext *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
               (IssueError *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe48);
  }
  bVar2 = isSupercompressionBlockCompressed(local_20);
  if ((bVar2) && ((in_RDI->header).levelCount == 0)) {
    toString_abi_cxx11_(in_stack_fffffffffffffdc4);
    error<std::__cxx11::string>
              ((ValidationContext *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
               (IssueError *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    std::__cxx11::string::~string(local_1d8);
  }
  local_1dc = 1;
  puVar5 = std::max<unsigned_int>(&(in_RDI->header).levelCount,&local_1dc);
  in_RDI->numLevels = *puVar5;
  puVar5 = std::max<unsigned_int>(&(in_RDI->header).pixelWidth,&(in_RDI->header).pixelHeight);
  puVar5 = std::max<unsigned_int>(puVar5,&(in_RDI->header).pixelDepth);
  local_1e0 = *puVar5;
  __x = extraout_XMM0_Qa;
  if (local_1e0 < (uint)(1 << ((char)in_RDI->numLevels - 1U & 0x1f))) {
    error<unsigned_int&,unsigned_int_const&>
              (in_RDI,(IssueError *)issue,(uint *)in_stack_fffffffffffffd98,
               (uint *)in_stack_fffffffffffffd90);
    __x = extraout_XMM0_Qa_00;
  }
  if (((in_RDI->header).supercompressionScheme < 0x10000) ||
     (0x1ffff < (in_RDI->header).supercompressionScheme)) {
    if (3 < (in_RDI->header).supercompressionScheme) {
      toString_abi_cxx11_(in_stack_fffffffffffffdc4);
      error<std::__cxx11::string>
                ((ValidationContext *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                 (IssueError *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
      __x = (double)std::__cxx11::string::~string(local_220);
    }
  }
  else {
    toString_abi_cxx11_(in_stack_fffffffffffffdc4);
    warning<std::__cxx11::string>
              (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    __x = (double)std::__cxx11::string::~string(local_200);
  }
  if ((in_RDI->checkGLTFBasisU & 1U) != 0) {
    kVar1 = (in_RDI->header).supercompressionScheme;
    if (((kVar1 != 0) && (kVar1 != 1)) && (kVar1 != 2)) {
      toString_abi_cxx11_(in_stack_fffffffffffffdc4);
      error<std::__cxx11::string>
                ((ValidationContext *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                 (IssueError *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
      __x = (double)std::__cxx11::string::~string(local_240);
    }
    if ((in_RDI->header).pixelDepth != 0) {
      in_stack_fffffffffffffdbc = 0;
      error<char_const(&)[11],unsigned_int&,int>
                ((ValidationContext *)(ulong)in_stack_fffffffffffffdb8,
                 (IssueError *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                 (char (*) [11])in_RDI,(uint *)issue,(int *)in_stack_fffffffffffffd98);
      __x = extraout_XMM0_Qa_01;
    }
    if ((in_RDI->header).layerCount != 0) {
      in_stack_fffffffffffffdb8 = 0;
      error<char_const(&)[11],unsigned_int&,int>
                ((ValidationContext *)((ulong)in_stack_fffffffffffffdbc << 0x20),
                 (IssueError *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                 (char (*) [11])in_RDI,(uint *)issue,(int *)in_stack_fffffffffffffd98);
      __x = extraout_XMM0_Qa_02;
    }
    if ((in_RDI->header).faceCount != 1) {
      error<char_const(&)[10],unsigned_int&,int>
                ((ValidationContext *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                 (IssueError *)CONCAT44(1,in_stack_fffffffffffffdb0),(char (*) [10])in_RDI,
                 (uint *)issue,(int *)in_stack_fffffffffffffd98);
      __x = extraout_XMM0_Qa_03;
    }
    if (((in_RDI->header).pixelWidth & 3) != 0) {
      error<char_const(&)[11],unsigned_int&>
                (in_RDI,(IssueError *)issue,(char (*) [11])in_stack_fffffffffffffd98,
                 (uint *)in_stack_fffffffffffffd90);
      __x = extraout_XMM0_Qa_04;
    }
    if (((in_RDI->header).pixelHeight & 3) != 0) {
      error<char_const(&)[12],unsigned_int&>
                (in_RDI,(IssueError *)issue,(char (*) [12])in_stack_fffffffffffffd98,
                 (uint *)in_stack_fffffffffffffd90);
      __x = extraout_XMM0_Qa_05;
    }
    log2(__x);
    if (((in_RDI->header).levelCount != 1) && ((in_RDI->header).levelCount != extraout_EAX + 1U)) {
      error<unsigned_int&,unsigned_int&>
                (in_RDI,(IssueError *)issue,(uint *)in_stack_fffffffffffffd98,
                 (uint *)in_stack_fffffffffffffd90);
    }
  }
  return;
}

Assistant:

void ValidationContext::validateHeader() {
    static constexpr uint8_t ktx2_identifier_reference[12] = KTX2_IDENTIFIER_REF;

    read(0, &header, sizeof(KTX_header2), "the header");
    const auto vkFormat = VkFormat(header.vkFormat);
    const auto supercompressionScheme = ktxSupercmpScheme(header.supercompressionScheme);

    // Validate file identifier
    if (std::memcmp(&header.identifier, ktx2_identifier_reference, 12) != 0)
        fatal(FileError::NotKTX2);

    // Validate vkFormat
    if (isProhibitedFormat(vkFormat)) {
        error(HeaderData::ProhibitedFormat, toString(vkFormat));

    } else if (!isFormatValid(vkFormat)) {
        if (vkFormat <= VK_FORMAT_MAX_STANDARD_ENUM)
            error(HeaderData::InvalidFormat, toString(vkFormat));
        if (VK_FORMAT_MAX_STANDARD_ENUM < vkFormat && vkFormat < 1000001000)
            error(HeaderData::InvalidFormat, toString(vkFormat));
        if (1000001000 <= vkFormat && !isFormatKnown(vkFormat))
            warning(HeaderData::UnknownFormat, toString(vkFormat));
    }

    if (header.supercompressionScheme == KTX_SS_BASIS_LZ) {
        if (header.vkFormat != VK_FORMAT_UNDEFINED)
            error(HeaderData::VkFormatAndBasis, toString(vkFormat));
    }

    // Validate typeSize
    if (header.vkFormat == VK_FORMAT_UNDEFINED) {
        if (header.typeSize != 1)
            error(HeaderData::TypeSizeNotOne, header.typeSize, toString(vkFormat));

    } else if (isFormatBlockCompressed(vkFormat)) {
        if (header.typeSize != 1)
            error(HeaderData::TypeSizeNotOne, header.typeSize, toString(vkFormat));
    }
    // Additional checks are performed on typeSize after the DFD is parsed

    // Validate image dimensions
    if (header.pixelWidth == 0)
        error(HeaderData::WidthZero);

    if (isFormatBlockCompressed(vkFormat))
        if (header.pixelHeight == 0)
            error(HeaderData::BlockCompressedNoHeight, toString(vkFormat));
    if (isSupercompressionBlockCompressed(supercompressionScheme))
        if (header.pixelHeight == 0)
            error(HeaderData::BlockCompressedNoHeight, toString(supercompressionScheme));
    // Additional block-compressed formats (like UASTC) are detected after the DFD is parsed to validate pixelHeight

    if (header.faceCount == 6)
        if (header.pixelWidth != header.pixelHeight)
            error(HeaderData::CubeHeightWidthMismatch, header.pixelWidth, header.pixelHeight);

    if (header.pixelDepth != 0 && header.pixelHeight == 0)
        error(HeaderData::DepthNoHeight, header.pixelDepth);

    if (isFormat3DBlockCompressed(vkFormat))
        if (header.pixelDepth == 0)
            error(HeaderData::DepthBlockCompressedNoDepth, toString(vkFormat));

    if (isFormatDepth(vkFormat) || isFormatStencil(vkFormat))
        if (header.pixelDepth != 0)
            error(HeaderData::DepthStencilFormatWithDepth, header.pixelDepth, toString(vkFormat));

    if (header.faceCount == 6)
        if (header.pixelDepth != 0)
            error(HeaderData::CubeWithDepth, header.pixelDepth);

    // Detect dimension counts
    if (header.pixelDepth != 0) {
        dimensionCount = 3;
        if (header.layerCount != 0)
            warning(HeaderData::ThreeDArray); // Warning on 3D Array textures
    } else if (header.pixelHeight != 0) {
        dimensionCount = 2;
    } else {
        dimensionCount = 1;
    }

    // Validate layerCount to actual number of layers.
    numLayers = std::max(header.layerCount, 1u);

    // Validate faceCount
    if (header.faceCount != 6 && header.faceCount != 1)
        error(HeaderData::InvalidFaceCount, header.faceCount);

    // 2D Cube map faces were validated by CubeHeightWidthMismatch and CubeWithDepth

    // Validate levelCount
    if (isFormatBlockCompressed(vkFormat))
        if (header.levelCount == 0)
            error(HeaderData::BlockCompressedNoLevel, toString(vkFormat));
    if (isSupercompressionBlockCompressed(supercompressionScheme))
        if (header.levelCount == 0)
            error(HeaderData::BlockCompressedNoLevel, toString(supercompressionScheme));
    // Additional block-compressed formats (like UASTC) are detected after the DFD is parsed to validate levelCount

    numLevels = std::max(header.levelCount, 1u);

    // This test works for arrays too because height or depth will be 0.
    const auto max_dim = std::max(std::max(header.pixelWidth, header.pixelHeight), header.pixelDepth);
    if (max_dim < (1u << (numLevels - 1u))) {
        // Can't have more mip levels than 1 + log2(max(width, height, depth))
        error(HeaderData::TooManyMipLevels, numLevels, max_dim);
    }

    // Validate supercompressionScheme
    if (KTX_SS_BEGIN_VENDOR_RANGE <= header.supercompressionScheme && header.supercompressionScheme <= KTX_SS_END_VENDOR_RANGE)
        warning(HeaderData::VendorSupercompression, toString(supercompressionScheme));
    else if (header.supercompressionScheme < KTX_SS_BEGIN_RANGE || KTX_SS_END_RANGE < header.supercompressionScheme)
        error(HeaderData::InvalidSupercompression, toString(supercompressionScheme));

    // Validate GLTF KHR_texture_basisu compatibility, if needed
    if (checkGLTFBasisU) {
        // Check for allowed supercompression schemes
        switch (header.supercompressionScheme) {
        case KTX_SS_NONE: [[fallthrough]];
        case KTX_SS_BASIS_LZ: [[fallthrough]];
        case KTX_SS_ZSTD:
            break;
        default:
            error(HeaderData::InvalidSupercompressionGLTFBU, toString(supercompressionScheme));
            break;
        }

        // Check that texture type is 2D
        // NOTE: pixelHeight == 0 already covered by other error codes
        if (header.pixelDepth != 0)
            error(HeaderData::InvalidTextureTypeGLTFBU, "pixelDepth", header.pixelDepth, 0);
        if (header.layerCount != 0)
            error(HeaderData::InvalidTextureTypeGLTFBU, "layerCount", header.layerCount, 0);
        if (header.faceCount != 1)
            error(HeaderData::InvalidTextureTypeGLTFBU, "faceCount", header.faceCount, 1);

        // Check that width and height are multiples of 4
        if (header.pixelWidth % 4 != 0)
            error(HeaderData::InvalidPixelWidthHeightGLTFBU, "pixelWidth", header.pixelWidth);
        if (header.pixelHeight % 4 != 0)
            error(HeaderData::InvalidPixelWidthHeightGLTFBU, "pixelHeight", header.pixelHeight);

        // Check that levelCount is 1 or that the full mip pyramid is present
        uint32_t fullMipPyramidLevelCount = 1 + (uint32_t)log2(max_dim);
        if (header.levelCount != 1 && header.levelCount != fullMipPyramidLevelCount)
            error(HeaderData::InvalidLevelCountGLTFBU, header.levelCount, fullMipPyramidLevelCount);
    }
}